

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O2

void __thiscall
slang::ast::CoverageBinSymbol::visitExprs<register_has_no_reset::AlwaysFFVisitor&>
          (CoverageBinSymbol *this,AlwaysFFVisitor *visitor)

{
  Expression *pEVar1;
  BinsSelectExpr *this_00;
  pointer psVar2;
  TransRangeList *rangeList;
  TransRangeList *this_01;
  long lVar3;
  span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL> *set;
  pointer psVar4;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar5;
  span<const_std::span<const_slang::ast::CoverageBinSymbol::TransRangeList,_18446744073709551615UL>,_18446744073709551615UL>
  sVar6;
  
  pEVar1 = getIffExpr(this);
  if (pEVar1 != (Expression *)0x0) {
    Expression::visit<register_has_no_reset::AlwaysFFVisitor&>(pEVar1,visitor);
  }
  pEVar1 = getNumberOfBinsExpr(this);
  if (pEVar1 != (Expression *)0x0) {
    Expression::visit<register_has_no_reset::AlwaysFFVisitor&>(pEVar1,visitor);
  }
  pEVar1 = getSetCoverageExpr(this);
  if (pEVar1 != (Expression *)0x0) {
    Expression::visit<register_has_no_reset::AlwaysFFVisitor&>(pEVar1,visitor);
  }
  pEVar1 = getWithExpr(this);
  if (pEVar1 != (Expression *)0x0) {
    Expression::visit<register_has_no_reset::AlwaysFFVisitor&>(pEVar1,visitor);
  }
  this_00 = getCrossSelectExpr(this);
  if (this_00 != (BinsSelectExpr *)0x0) {
    BinsSelectExpr::visit<register_has_no_reset::AlwaysFFVisitor>(this_00,visitor);
  }
  sVar5 = getValues(this);
  for (lVar3 = 0; sVar5._M_extent._M_extent_value._M_extent_value << 3 != lVar3; lVar3 = lVar3 + 8)
  {
    Expression::visit<register_has_no_reset::AlwaysFFVisitor&>
              (*(Expression **)((long)sVar5._M_ptr + lVar3),visitor);
  }
  sVar6 = getTransList(this);
  psVar2 = sVar6._M_ptr;
  psVar4 = psVar2 + sVar6._M_extent._M_extent_value._M_extent_value;
  for (; psVar2 != psVar4; psVar2 = psVar2 + 1) {
    this_01 = psVar2->_M_ptr;
    for (lVar3 = (psVar2->_M_extent)._M_extent_value * 0x28; lVar3 != 0; lVar3 = lVar3 + -0x28) {
      TransRangeList::visitExprs<register_has_no_reset::AlwaysFFVisitor&>(this_01,visitor);
      this_01 = this_01 + 1;
    }
  }
  return;
}

Assistant:

void CoverageBinSymbol::visitExprs(TVisitor&& visitor) const {
    if (auto expr = getIffExpr())
        expr->visit(visitor);
    if (auto expr = getNumberOfBinsExpr())
        expr->visit(visitor);
    if (auto expr = getSetCoverageExpr())
        expr->visit(visitor);
    if (auto expr = getWithExpr())
        expr->visit(visitor);
    if (auto expr = getCrossSelectExpr())
        expr->visit(visitor);

    for (auto val : getValues())
        val->visit(visitor);

    for (auto& set : getTransList()) {
        for (auto& rangeList : set)
            rangeList.visitExprs(visitor);
    }
}